

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attribute-eval.cc
# Opt level: O0

bool tinyusdz::tydra::anon_unknown_1::ToTerminalAttributeValue
               (Attribute *attr,TerminalAttributeValue *value,string *err,double t,
               TimeSampleInterpolationType tinterp)

{
  bool bVar1;
  Variability VVar2;
  PrimVar *this;
  AttrMeta *pAVar3;
  AttrMeta *this_00;
  Variability *pVVar4;
  ostream *poVar5;
  string local_528 [32];
  ostringstream local_508 [8];
  ostringstream ss_e_2;
  undefined1 local_390 [8];
  Value v_1;
  Value *v;
  ostringstream local_350 [8];
  ostringstream ss_e_1;
  PrimVar *var;
  ostringstream local_1b0 [8];
  ostringstream ss_e;
  TimeSampleInterpolationType tinterp_local;
  double t_local;
  string *err_local;
  TerminalAttributeValue *value_local;
  Attribute *attr_local;
  
  if (value == (TerminalAttributeValue *)0x0) {
    attr_local._7_1_ = 0;
  }
  else {
    bVar1 = Attribute::is_blocked(attr);
    if (bVar1) {
      ::std::__cxx11::ostringstream::ostringstream(local_1b0);
      poVar5 = ::std::operator<<((ostream *)local_1b0,"[error]");
      poVar5 = ::std::operator<<(poVar5,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/attribute-eval.cc"
                                );
      poVar5 = ::std::operator<<(poVar5,":");
      poVar5 = ::std::operator<<(poVar5,"ToTerminalAttributeValue");
      poVar5 = ::std::operator<<(poVar5,"():");
      poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x20);
      ::std::operator<<(poVar5," ");
      poVar5 = ::std::operator<<((ostream *)local_1b0,"Attribute is None(Value Blocked).");
      ::std::operator<<(poVar5,"\n");
      if (err != (string *)0x0) {
        ::std::__cxx11::ostringstream::str();
        ::std::__cxx11::string::operator+=((string *)err,(string *)&var);
        ::std::__cxx11::string::~string((string *)&var);
      }
      attr_local._7_1_ = 0;
      ::std::__cxx11::ostringstream::~ostringstream(local_1b0);
    }
    else {
      this = Attribute::get_var(attr);
      pAVar3 = Attribute::metas(attr);
      this_00 = TerminalAttributeValue::meta(value);
      AttrMetas::operator=(this_00,pAVar3);
      VVar2 = Attribute::variability(attr);
      pVVar4 = TerminalAttributeValue::variability(value);
      *pVVar4 = VVar2;
      bVar1 = primvar::PrimVar::is_valid(this);
      if (bVar1) {
        bVar1 = primvar::PrimVar::is_scalar(this);
        if (bVar1) {
          v_1.v_.vtable = (vtable_type *)primvar::PrimVar::value_raw(this);
          TerminalAttributeValue::set_value(value,(Value *)v_1.v_.vtable);
        }
        else {
          bVar1 = primvar::PrimVar::is_timesamples(this);
          if (bVar1) {
            tinyusdz::value::Value::Value((Value *)local_390);
            bVar1 = primvar::PrimVar::get_interpolated_value(this,t,tinterp,(Value *)local_390);
            if (bVar1) {
              TerminalAttributeValue::set_value(value,(Value *)local_390);
              bVar1 = false;
            }
            else {
              ::std::__cxx11::ostringstream::ostringstream(local_508);
              poVar5 = ::std::operator<<((ostream *)local_508,"[error]");
              poVar5 = ::std::operator<<(poVar5,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/attribute-eval.cc"
                                        );
              poVar5 = ::std::operator<<(poVar5,":");
              poVar5 = ::std::operator<<(poVar5,"ToTerminalAttributeValue");
              poVar5 = ::std::operator<<(poVar5,"():");
              poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x38);
              ::std::operator<<(poVar5," ");
              poVar5 = ::std::operator<<((ostream *)local_508,"Interpolate TimeSamples failed.");
              ::std::operator<<(poVar5,"\n");
              if (err != (string *)0x0) {
                ::std::__cxx11::ostringstream::str();
                ::std::__cxx11::string::operator+=((string *)err,local_528);
                ::std::__cxx11::string::~string(local_528);
              }
              attr_local._7_1_ = 0;
              bVar1 = true;
              ::std::__cxx11::ostringstream::~ostringstream(local_508);
            }
            tinyusdz::value::Value::~Value((Value *)local_390);
            if (bVar1) goto LAB_0081ae82;
          }
        }
        attr_local._7_1_ = 1;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_350);
        poVar5 = ::std::operator<<((ostream *)local_350,"[error]");
        poVar5 = ::std::operator<<(poVar5,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/attribute-eval.cc"
                                  );
        poVar5 = ::std::operator<<(poVar5,":");
        poVar5 = ::std::operator<<(poVar5,"ToTerminalAttributeValue");
        poVar5 = ::std::operator<<(poVar5,"():");
        poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x2e);
        ::std::operator<<(poVar5," ");
        poVar5 = ::std::operator<<((ostream *)local_350,"[InternalError] Attribute is invalid.");
        ::std::operator<<(poVar5,"\n");
        if (err != (string *)0x0) {
          ::std::__cxx11::ostringstream::str();
          ::std::__cxx11::string::operator+=((string *)err,(string *)&v);
          ::std::__cxx11::string::~string((string *)&v);
        }
        attr_local._7_1_ = 0;
        ::std::__cxx11::ostringstream::~ostringstream(local_350);
      }
    }
  }
LAB_0081ae82:
  return (bool)(attr_local._7_1_ & 1);
}

Assistant:

bool ToTerminalAttributeValue(
    const Attribute &attr, TerminalAttributeValue *value, std::string *err,
    const double t, const value::TimeSampleInterpolationType tinterp) {
  if (!value) {
    // ???
    return false;
  }

  if (attr.is_blocked()) {
    PUSH_ERROR_AND_RETURN("Attribute is None(Value Blocked).");
  }

  const primvar::PrimVar &var = attr.get_var();

  value->meta() = attr.metas();
  value->variability() = attr.variability();

  DCOUT("var has_default " << var.has_default());
  DCOUT("var has_timesamples " << var.has_default());
  DCOUT("var is_blocked " << var.is_blocked());
  DCOUT("var is_valid " << var.is_valid());

  if (!var.is_valid()) {
    PUSH_ERROR_AND_RETURN("[InternalError] Attribute is invalid.");
  } else if (var.is_scalar()) {
    const value::Value &v = var.value_raw();
    DCOUT("Attribute is scalar type:" << v.type_name());
    DCOUT("Attribute value = " << pprint_value(v));

    value->set_value(v);
  } else if (var.is_timesamples()) {
    value::Value v;
    if (!var.get_interpolated_value(t, tinterp, &v)) {
      PUSH_ERROR_AND_RETURN("Interpolate TimeSamples failed.");
      return false;
    }

    value->set_value(v);
  }

  return true;
}